

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialAnalyzer.cpp
# Opt level: O3

void __thiscall SerialAnalyzer::WorkerThread(SerialAnalyzer *this)

{
  Mode MVar1;
  SerialAnalyzerSettings *pSVar2;
  SerialAnalyzerResults *pSVar3;
  char cVar4;
  ulong uVar5;
  char cVar6;
  U32 UVar7;
  BitState BVar8;
  int iVar9;
  AnalyzerChannelData *pAVar10;
  long lVar11;
  ulonglong uVar12;
  undefined8 uVar13;
  byte bVar14;
  MarkerType MVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int iVar32;
  undefined1 auVar30 [16];
  int iVar33;
  undefined1 auVar31 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  int iVar52;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  int iVar53;
  undefined1 auVar51 [16];
  int iVar54;
  int iVar58;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar59 [16];
  undefined1 in_XMM13 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  U8 bytes [8];
  U64 data;
  FrameV2 frameV2;
  DataBuilder data_builder;
  undefined1 local_e4 [8];
  undefined4 local_dc;
  undefined8 local_d8;
  ulong local_d0;
  FrameV2 local_c8 [12];
  uint local_bc;
  ulong local_b8;
  ulonglong local_b0;
  DataBuilder local_a8 [12];
  int local_9c;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulonglong local_70;
  undefined8 local_68;
  ulong local_60;
  byte local_4f;
  undefined1 local_48 [16];
  
  UVar7 = Analyzer::GetSampleRate();
  this->mSampleRateHz = UVar7;
  ComputeSampleOffsets(this);
  pSVar2 = (this->mSettings)._M_t.
           super___uniq_ptr_impl<SerialAnalyzerSettings,_std::default_delete<SerialAnalyzerSettings>_>
           ._M_t.
           super__Tuple_impl<0UL,_SerialAnalyzerSettings_*,_std::default_delete<SerialAnalyzerSettings>_>
           .super__Head_base<0UL,_SerialAnalyzerSettings_*,_false>._M_head_impl;
  UVar7 = pSVar2->mBitsPerTransfer;
  MVar1 = pSVar2->mSerialMode;
  local_bc = UVar7 + 7;
  bVar21 = pSVar2->mInverted;
  this->mBitHigh = bVar21 ^ BIT_HIGH;
  this->mBitLow = (uint)bVar21;
  uVar17 = (MVar1 != Normal) + UVar7;
  if (uVar17 == 0) {
    uVar19 = 0;
  }
  else {
    uVar18 = 1;
    uVar19 = 0;
    uVar20 = uVar17;
    do {
      uVar19 = uVar19 | uVar18;
      uVar18 = uVar18 * 2;
      uVar20 = uVar20 - 1;
    } while (uVar20 != 0);
  }
  uVar20 = local_bc >> 3;
  pAVar10 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
  this->mSerial = pAVar10;
  AnalyzerChannelData::TrackMinimumPulseWidth();
  BVar8 = AnalyzerChannelData::GetBitState();
  if (BVar8 == this->mBitLow) {
    AnalyzerChannelData::AdvanceToNextEdge();
  }
  local_90 = (ulong)(uVar17 - 1);
  local_98 = uVar19 >> 1;
  local_88 = (ulong)uVar20;
  local_b8 = (ulong)(uVar20 + 0xf & 0xfffffff0);
  lVar11 = local_88 - 1;
  local_48._8_4_ = (int)lVar11;
  local_48._0_8_ = lVar11;
  local_48._12_4_ = (int)((ulong)lVar11 >> 0x20);
  local_9c = uVar20 * 8 + -8;
  local_80 = (ulong)uVar17;
  local_78 = (ulong)uVar17;
  do {
    AnalyzerChannelData::AdvanceToNextEdge();
    uVar12 = AnalyzerChannelData::GetSampleNumber();
    local_d8 = 0;
    DataBuilder::DataBuilder(local_a8);
    uVar18 = local_80;
    DataBuilder::Reset((ulonglong *)local_a8,(ShiftOrder)&local_d8,
                       ((this->mSettings)._M_t.
                        super___uniq_ptr_impl<SerialAnalyzerSettings,_std::default_delete<SerialAnalyzerSettings>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_SerialAnalyzerSettings_*,_std::default_delete<SerialAnalyzerSettings>_>
                        .super__Head_base<0UL,_SerialAnalyzerSettings_*,_false>._M_head_impl)->
                       mShiftOrder);
    local_b0 = uVar12;
    if ((int)uVar18 != 0) {
      uVar18 = 0;
      do {
        AnalyzerChannelData::Advance((uint)this->mSerial);
        AnalyzerChannelData::GetBitState();
        DataBuilder::AddBit((BitState)local_a8);
        uVar12 = uVar12 + (this->mSampleOffsets).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar18];
        AnalyzerResults::AddMarker
                  ((ulonglong)
                   (this->mResults)._M_t.
                   super___uniq_ptr_impl<SerialAnalyzerResults,_std::default_delete<SerialAnalyzerResults>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_SerialAnalyzerResults_*,_std::default_delete<SerialAnalyzerResults>_>
                   .super__Head_base<0UL,_SerialAnalyzerResults_*,_false>._M_head_impl,
                   (MarkerType)uVar12,(Channel *)0x0);
        uVar18 = uVar18 + 1;
      } while (local_78 != uVar18);
    }
    uVar18 = local_b8;
    MVar15 = (MarkerType)uVar12;
    pSVar2 = (this->mSettings)._M_t.
             super___uniq_ptr_impl<SerialAnalyzerSettings,_std::default_delete<SerialAnalyzerSettings>_>
             ._M_t.
             super__Tuple_impl<0UL,_SerialAnalyzerSettings_*,_std::default_delete<SerialAnalyzerSettings>_>
             .super__Head_base<0UL,_SerialAnalyzerSettings_*,_false>._M_head_impl;
    if (pSVar2->mInverted != false) {
      local_d8 = ~local_d8 & uVar19;
    }
    MVar1 = pSVar2->mSerialMode;
    if (MVar1 == Normal) {
      local_d0 = 0;
    }
    else {
      local_d0 = local_d8 >> ((byte)local_90 & 0x3f);
      if (MVar1 == MpModeMsbZeroMeansAddress) {
        local_d0 = local_d0 ^ 1;
      }
      else if (MVar1 != MpModeMsbOneMeansAddress) {
        local_d0 = 0;
      }
      local_d8 = local_d8 & local_98;
    }
    if (pSVar2->mParity == None) {
      local_dc = 0;
    }
    else {
      AnalyzerChannelData::Advance((uint)this->mSerial);
      uVar17 = AnalyzerHelpers::GetOnesCount(local_d8);
      cVar6 = AnalyzerHelpers::IsEven((ulong)uVar17);
      if (((this->mSettings)._M_t.
           super___uniq_ptr_impl<SerialAnalyzerSettings,_std::default_delete<SerialAnalyzerSettings>_>
           ._M_t.
           super__Tuple_impl<0UL,_SerialAnalyzerSettings_*,_std::default_delete<SerialAnalyzerSettings>_>
           .super__Head_base<0UL,_SerialAnalyzerSettings_*,_false>._M_head_impl)->mParity == Even) {
        if (cVar6 != '\0') {
          uVar13 = AnalyzerChannelData::GetBitState();
          goto LAB_00106114;
        }
        uVar13 = AnalyzerChannelData::GetBitState();
LAB_00106107:
        bVar21 = (BitState)uVar13 == this->mBitHigh;
      }
      else {
        if (cVar6 != '\0') {
          uVar13 = AnalyzerChannelData::GetBitState();
          goto LAB_00106107;
        }
        uVar13 = AnalyzerChannelData::GetBitState();
LAB_00106114:
        bVar21 = (BitState)uVar13 == this->mBitLow;
      }
      local_dc = (undefined4)CONCAT71((int7)((ulong)uVar13 >> 8),!bVar21);
      MVar15 = MVar15 + this->mParityBitOffset;
      AnalyzerResults::AddMarker
                ((ulonglong)
                 (this->mResults)._M_t.
                 super___uniq_ptr_impl<SerialAnalyzerResults,_std::default_delete<SerialAnalyzerResults>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_SerialAnalyzerResults_*,_std::default_delete<SerialAnalyzerResults>_>
                 .super__Head_base<0UL,_SerialAnalyzerResults_*,_false>._M_head_impl,MVar15,
                 (Channel *)0x2);
    }
    AnalyzerChannelData::Advance((uint)this->mSerial);
    BVar8 = AnalyzerChannelData::GetBitState();
    if ((BVar8 == this->mBitHigh) &&
       (iVar9 = AnalyzerChannelData::Advance((uint)this->mSerial), iVar9 == 0)) {
      bVar21 = false;
    }
    else {
      MVar15 = MVar15 + this->mStartOfStopBitOffset;
      AnalyzerResults::AddMarker
                ((ulonglong)
                 (this->mResults)._M_t.
                 super___uniq_ptr_impl<SerialAnalyzerResults,_std::default_delete<SerialAnalyzerResults>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_SerialAnalyzerResults_*,_std::default_delete<SerialAnalyzerResults>_>
                 .super__Head_base<0UL,_SerialAnalyzerResults_*,_false>._M_head_impl,MVar15,
                 (Channel *)0x7);
      bVar21 = true;
      if (this->mEndOfStopBitOffset != 0) {
        AnalyzerResults::AddMarker
                  ((ulonglong)
                   (this->mResults)._M_t.
                   super___uniq_ptr_impl<SerialAnalyzerResults,_std::default_delete<SerialAnalyzerResults>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_SerialAnalyzerResults_*,_std::default_delete<SerialAnalyzerResults>_>
                   .super__Head_base<0UL,_SerialAnalyzerResults_*,_false>._M_head_impl,
                   MVar15 + this->mEndOfStopBitOffset,(Channel *)0x7);
      }
    }
    Frame::Frame((Frame *)&local_70);
    local_70 = local_b0;
    local_68 = AnalyzerChannelData::GetSampleNumber();
    local_60 = local_d8;
    cVar6 = (char)local_dc;
    bVar14 = 0;
    if (cVar6 != '\0') {
      bVar14 = 0x82;
    }
    local_4f = bVar14 | 0x81;
    if (!bVar21) {
      local_4f = bVar14;
    }
    if ((local_d0 & 1) != 0) {
      local_4f = local_4f | 4;
      AnalyzerResults::CommitPacketAndStartNewPacket();
    }
    AnalyzerResults::AddFrame
              ((Frame *)(this->mResults)._M_t.
                        super___uniq_ptr_impl<SerialAnalyzerResults,_std::default_delete<SerialAnalyzerResults>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_SerialAnalyzerResults_*,_std::default_delete<SerialAnalyzerResults>_>
                        .super__Head_base<0UL,_SerialAnalyzerResults_*,_false>._M_head_impl);
    FrameV2::FrameV2(local_c8);
    uVar5 = local_d8;
    if (7 < local_bc) {
      uVar16 = 0;
      auVar22 = _DAT_00109090;
      auVar23 = _DAT_00109080;
      auVar24 = _DAT_00109070;
      auVar25 = _DAT_00109060;
      auVar26 = _DAT_00109050;
      auVar27 = _DAT_00109040;
      auVar28 = _DAT_00109030;
      auVar29 = _DAT_00109020;
      iVar9 = local_9c;
      do {
        auVar30 = local_48 ^ _DAT_001090a0;
        auVar34 = auVar22 ^ _DAT_001090a0;
        iVar52 = auVar30._0_4_;
        iVar54 = -(uint)(iVar52 < auVar34._0_4_);
        iVar53 = auVar30._4_4_;
        auVar35._4_4_ = -(uint)(iVar53 < auVar34._4_4_);
        iVar32 = auVar30._8_4_;
        iVar58 = -(uint)(iVar32 < auVar34._8_4_);
        iVar33 = auVar30._12_4_;
        auVar35._12_4_ = -(uint)(iVar33 < auVar34._12_4_);
        auVar45._4_4_ = iVar54;
        auVar45._0_4_ = iVar54;
        auVar45._8_4_ = iVar58;
        auVar45._12_4_ = iVar58;
        auVar59 = pshuflw(in_XMM12,auVar45,0xe8);
        auVar30._4_4_ = -(uint)(auVar34._4_4_ == iVar53);
        auVar30._12_4_ = -(uint)(auVar34._12_4_ == iVar33);
        auVar30._0_4_ = auVar30._4_4_;
        auVar30._8_4_ = auVar30._12_4_;
        auVar60 = pshuflw(in_XMM13,auVar30,0xe8);
        auVar35._0_4_ = auVar35._4_4_;
        auVar35._8_4_ = auVar35._12_4_;
        auVar34 = pshuflw(auVar59,auVar35,0xe8);
        auVar61._8_4_ = 0xffffffff;
        auVar61._0_8_ = 0xffffffffffffffff;
        auVar61._12_4_ = 0xffffffff;
        auVar34 = (auVar34 | auVar60 & auVar59) ^ auVar61;
        auVar34 = packssdw(auVar34,auVar34);
        if ((auVar34 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e4[uVar16] = (char)(uVar5 >> ((byte)iVar9 & 0x3f));
        }
        auVar35 = auVar30 & auVar45 | auVar35;
        auVar30 = packssdw(auVar35,auVar35);
        auVar30 = packssdw(auVar30 ^ auVar61,auVar30 ^ auVar61);
        auVar30 = packsswb(auVar30,auVar30);
        cVar4 = (char)uVar20;
        bVar14 = (byte)uVar16;
        if ((auVar30._0_4_ >> 8 & 1) != 0) {
          local_e4[uVar16 + 1] = (char)(uVar5 >> (((bVar14 ^ 0x1e) + cVar4) * '\b' & 0x3f));
        }
        auVar30 = auVar23 ^ _DAT_001090a0;
        iVar54 = -(uint)(iVar52 < auVar30._0_4_);
        auVar60._4_4_ = -(uint)(iVar53 < auVar30._4_4_);
        iVar58 = -(uint)(iVar32 < auVar30._8_4_);
        auVar60._12_4_ = -(uint)(iVar33 < auVar30._12_4_);
        auVar34._4_4_ = iVar54;
        auVar34._0_4_ = iVar54;
        auVar34._8_4_ = iVar58;
        auVar34._12_4_ = iVar58;
        auVar59._4_4_ = -(uint)(auVar30._4_4_ == iVar53);
        auVar59._12_4_ = -(uint)(auVar30._12_4_ == iVar33);
        auVar59._0_4_ = auVar59._4_4_;
        auVar59._8_4_ = auVar59._12_4_;
        auVar60._0_4_ = auVar60._4_4_;
        auVar60._8_4_ = auVar60._12_4_;
        auVar30 = auVar59 & auVar34 | auVar60;
        auVar30 = packssdw(auVar30,auVar30);
        auVar30 = packssdw(auVar30 ^ auVar61,auVar30 ^ auVar61);
        auVar30 = packsswb(auVar30,auVar30);
        if ((auVar30._0_4_ >> 0x10 & 1) != 0) {
          local_e4[uVar16 + 2] = (char)(uVar5 >> (((bVar14 ^ 0x1d) + cVar4) * '\b' & 0x3f));
        }
        auVar34 = pshufhw(auVar34,auVar34,0x84);
        auVar45 = pshufhw(auVar59,auVar59,0x84);
        auVar35 = pshufhw(auVar34,auVar60,0x84);
        auVar34 = (auVar35 | auVar45 & auVar34) ^ auVar61;
        auVar34 = packssdw(auVar34,auVar34);
        auVar34 = packsswb(auVar34,auVar34);
        if ((auVar34._0_4_ >> 0x18 & 1) != 0) {
          local_e4[uVar16 + 3] = (char)(uVar5 >> (((bVar14 ^ 0x1c) + cVar4) * '\b' & 0x3f));
        }
        auVar34 = auVar24 ^ _DAT_001090a0;
        iVar54 = -(uint)(iVar52 < auVar34._0_4_);
        auVar37._4_4_ = -(uint)(iVar53 < auVar34._4_4_);
        iVar58 = -(uint)(iVar32 < auVar34._8_4_);
        auVar37._12_4_ = -(uint)(iVar33 < auVar34._12_4_);
        auVar46._4_4_ = iVar54;
        auVar46._0_4_ = iVar54;
        auVar46._8_4_ = iVar58;
        auVar46._12_4_ = iVar58;
        auVar30 = pshuflw(auVar30,auVar46,0xe8);
        auVar36._4_4_ = -(uint)(auVar34._4_4_ == iVar53);
        auVar36._12_4_ = -(uint)(auVar34._12_4_ == iVar33);
        auVar36._0_4_ = auVar36._4_4_;
        auVar36._8_4_ = auVar36._12_4_;
        auVar35 = pshuflw(auVar61,auVar36,0xe8);
        auVar37._0_4_ = auVar37._4_4_;
        auVar37._8_4_ = auVar37._12_4_;
        auVar34 = pshuflw(auVar30,auVar37,0xe8);
        auVar62._8_4_ = 0xffffffff;
        auVar62._0_8_ = 0xffffffffffffffff;
        auVar62._12_4_ = 0xffffffff;
        auVar30 = (auVar34 | auVar35 & auVar30) ^ auVar62;
        auVar30 = packssdw(auVar30,auVar30);
        auVar30 = packsswb(auVar30,auVar30);
        if ((auVar30 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          local_e4[uVar16 + 4] = (char)(uVar5 >> (((bVar14 ^ 0x1b) + cVar4) * '\b' & 0x3f));
        }
        auVar37 = auVar36 & auVar46 | auVar37;
        auVar30 = packssdw(auVar37,auVar37);
        auVar30 = packssdw(auVar30 ^ auVar62,auVar30 ^ auVar62);
        auVar30 = packsswb(auVar30,auVar30);
        if ((auVar30._4_2_ >> 8 & 1) != 0) {
          local_e4[uVar16 + 5] = (char)(uVar5 >> (((bVar14 ^ 0x1a) + cVar4) * '\b' & 0x3f));
        }
        auVar30 = auVar25 ^ _DAT_001090a0;
        iVar54 = -(uint)(iVar52 < auVar30._0_4_);
        auVar55._4_4_ = -(uint)(iVar53 < auVar30._4_4_);
        iVar58 = -(uint)(iVar32 < auVar30._8_4_);
        auVar55._12_4_ = -(uint)(iVar33 < auVar30._12_4_);
        auVar38._4_4_ = iVar54;
        auVar38._0_4_ = iVar54;
        auVar38._8_4_ = iVar58;
        auVar38._12_4_ = iVar58;
        auVar47._4_4_ = -(uint)(auVar30._4_4_ == iVar53);
        auVar47._12_4_ = -(uint)(auVar30._12_4_ == iVar33);
        auVar47._0_4_ = auVar47._4_4_;
        auVar47._8_4_ = auVar47._12_4_;
        auVar55._0_4_ = auVar55._4_4_;
        auVar55._8_4_ = auVar55._12_4_;
        auVar30 = auVar47 & auVar38 | auVar55;
        auVar30 = packssdw(auVar30,auVar30);
        auVar30 = packssdw(auVar30 ^ auVar62,auVar30 ^ auVar62);
        auVar30 = packsswb(auVar30,auVar30);
        if ((auVar30 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          local_e4[uVar16 + 6] = (char)(uVar5 >> (((bVar14 ^ 0x19) + cVar4) * '\b' & 0x3f));
        }
        auVar34 = pshufhw(auVar38,auVar38,0x84);
        auVar45 = pshufhw(auVar47,auVar47,0x84);
        auVar35 = pshufhw(auVar34,auVar55,0x84);
        auVar34 = (auVar35 | auVar45 & auVar34) ^ auVar62;
        auVar34 = packssdw(auVar34,auVar34);
        auVar34 = packsswb(auVar34,auVar34);
        if ((auVar34._6_2_ >> 8 & 1) != 0) {
          local_e4[uVar16 + 7] = (char)(uVar5 >> (((bVar14 ^ 0x18) + cVar4) * '\b' & 0x3f));
        }
        auVar34 = auVar26 ^ _DAT_001090a0;
        iVar54 = -(uint)(iVar52 < auVar34._0_4_);
        auVar40._4_4_ = -(uint)(iVar53 < auVar34._4_4_);
        iVar58 = -(uint)(iVar32 < auVar34._8_4_);
        auVar40._12_4_ = -(uint)(iVar33 < auVar34._12_4_);
        auVar48._4_4_ = iVar54;
        auVar48._0_4_ = iVar54;
        auVar48._8_4_ = iVar58;
        auVar48._12_4_ = iVar58;
        auVar30 = pshuflw(auVar30,auVar48,0xe8);
        auVar39._4_4_ = -(uint)(auVar34._4_4_ == iVar53);
        auVar39._12_4_ = -(uint)(auVar34._12_4_ == iVar33);
        auVar39._0_4_ = auVar39._4_4_;
        auVar39._8_4_ = auVar39._12_4_;
        auVar35 = pshuflw(auVar62,auVar39,0xe8);
        auVar40._0_4_ = auVar40._4_4_;
        auVar40._8_4_ = auVar40._12_4_;
        auVar34 = pshuflw(auVar30,auVar40,0xe8);
        auVar63._8_4_ = 0xffffffff;
        auVar63._0_8_ = 0xffffffffffffffff;
        auVar63._12_4_ = 0xffffffff;
        auVar30 = (auVar34 | auVar35 & auVar30) ^ auVar63;
        auVar30 = packssdw(auVar30,auVar30);
        auVar30 = packsswb(auVar30,auVar30);
        if ((auVar30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(char *)((long)&local_dc + uVar16) =
               (char)(uVar5 >> (((bVar14 ^ 0x17) + cVar4) * '\b' & 0x3f));
        }
        auVar40 = auVar39 & auVar48 | auVar40;
        auVar30 = packssdw(auVar40,auVar40);
        auVar30 = packssdw(auVar30 ^ auVar63,auVar30 ^ auVar63);
        auVar30 = packsswb(auVar30,auVar30);
        if ((auVar30._8_2_ >> 8 & 1) != 0) {
          *(char *)((long)&local_dc + uVar16 + 1) =
               (char)(uVar5 >> (((bVar14 ^ 0x16) + cVar4) * '\b' & 0x3f));
        }
        auVar30 = auVar27 ^ _DAT_001090a0;
        iVar54 = -(uint)(iVar52 < auVar30._0_4_);
        auVar56._4_4_ = -(uint)(iVar53 < auVar30._4_4_);
        iVar58 = -(uint)(iVar32 < auVar30._8_4_);
        auVar56._12_4_ = -(uint)(iVar33 < auVar30._12_4_);
        auVar41._4_4_ = iVar54;
        auVar41._0_4_ = iVar54;
        auVar41._8_4_ = iVar58;
        auVar41._12_4_ = iVar58;
        auVar49._4_4_ = -(uint)(auVar30._4_4_ == iVar53);
        auVar49._12_4_ = -(uint)(auVar30._12_4_ == iVar33);
        auVar49._0_4_ = auVar49._4_4_;
        auVar49._8_4_ = auVar49._12_4_;
        auVar56._0_4_ = auVar56._4_4_;
        auVar56._8_4_ = auVar56._12_4_;
        auVar30 = auVar49 & auVar41 | auVar56;
        auVar30 = packssdw(auVar30,auVar30);
        auVar30 = packssdw(auVar30 ^ auVar63,auVar30 ^ auVar63);
        auVar30 = packsswb(auVar30,auVar30);
        if ((auVar30 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          *(char *)((long)&local_dc + uVar16 + 2) =
               (char)(uVar5 >> (((bVar14 ^ 0x15) + cVar4) * '\b' & 0x3f));
        }
        auVar34 = pshufhw(auVar41,auVar41,0x84);
        auVar45 = pshufhw(auVar49,auVar49,0x84);
        auVar35 = pshufhw(auVar34,auVar56,0x84);
        auVar34 = (auVar35 | auVar45 & auVar34) ^ auVar63;
        auVar34 = packssdw(auVar34,auVar34);
        auVar34 = packsswb(auVar34,auVar34);
        if ((auVar34._10_2_ >> 8 & 1) != 0) {
          *(char *)((long)&local_dc + uVar16 + 3) =
               (char)(uVar5 >> (((bVar14 ^ 0x14) + cVar4) * '\b' & 0x3f));
        }
        auVar34 = auVar28 ^ _DAT_001090a0;
        iVar54 = -(uint)(iVar52 < auVar34._0_4_);
        auVar43._4_4_ = -(uint)(iVar53 < auVar34._4_4_);
        iVar58 = -(uint)(iVar32 < auVar34._8_4_);
        auVar43._12_4_ = -(uint)(iVar33 < auVar34._12_4_);
        auVar50._4_4_ = iVar54;
        auVar50._0_4_ = iVar54;
        auVar50._8_4_ = iVar58;
        auVar50._12_4_ = iVar58;
        auVar30 = pshuflw(auVar30,auVar50,0xe8);
        auVar42._4_4_ = -(uint)(auVar34._4_4_ == iVar53);
        auVar42._12_4_ = -(uint)(auVar34._12_4_ == iVar33);
        auVar42._0_4_ = auVar42._4_4_;
        auVar42._8_4_ = auVar42._12_4_;
        auVar35 = pshuflw(auVar63,auVar42,0xe8);
        auVar43._0_4_ = auVar43._4_4_;
        auVar43._8_4_ = auVar43._12_4_;
        auVar34 = pshuflw(auVar30,auVar43,0xe8);
        in_XMM13._8_4_ = 0xffffffff;
        in_XMM13._0_8_ = 0xffffffffffffffff;
        in_XMM13._12_4_ = 0xffffffff;
        auVar30 = (auVar34 | auVar35 & auVar30) ^ in_XMM13;
        auVar30 = packssdw(auVar30,auVar30);
        auVar30 = packsswb(auVar30,auVar30);
        if ((auVar30 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(char *)((long)&local_d8 + uVar16) =
               (char)(uVar5 >> (((bVar14 ^ 0x13) + cVar4) * '\b' & 0x3f));
        }
        auVar43 = auVar42 & auVar50 | auVar43;
        auVar30 = packssdw(auVar43,auVar43);
        auVar30 = packssdw(auVar30 ^ in_XMM13,auVar30 ^ in_XMM13);
        auVar30 = packsswb(auVar30,auVar30);
        if ((auVar30._12_2_ >> 8 & 1) != 0) {
          *(char *)((long)&local_d8 + uVar16 + 1) =
               (char)(uVar5 >> (((bVar14 ^ 0x12) + cVar4) * '\b' & 0x3f));
        }
        auVar30 = auVar29 ^ _DAT_001090a0;
        auVar57._0_4_ = -(uint)(iVar52 < auVar30._0_4_);
        auVar57._4_4_ = -(uint)(iVar53 < auVar30._4_4_);
        auVar57._8_4_ = -(uint)(iVar32 < auVar30._8_4_);
        auVar57._12_4_ = -(uint)(iVar33 < auVar30._12_4_);
        auVar44._4_4_ = auVar57._0_4_;
        auVar44._0_4_ = auVar57._0_4_;
        auVar44._8_4_ = auVar57._8_4_;
        auVar44._12_4_ = auVar57._8_4_;
        iVar52 = -(uint)(auVar30._4_4_ == iVar53);
        iVar53 = -(uint)(auVar30._12_4_ == iVar33);
        auVar31._4_4_ = iVar52;
        auVar31._0_4_ = iVar52;
        auVar31._8_4_ = iVar53;
        auVar31._12_4_ = iVar53;
        auVar51._4_4_ = auVar57._4_4_;
        auVar51._0_4_ = auVar57._4_4_;
        auVar51._8_4_ = auVar57._12_4_;
        auVar51._12_4_ = auVar57._12_4_;
        in_XMM12 = auVar31 & auVar44 | auVar51;
        auVar30 = packssdw(auVar57,in_XMM12);
        auVar30 = packssdw(auVar30 ^ in_XMM13,auVar30 ^ in_XMM13);
        auVar30 = packsswb(auVar30,auVar30);
        if ((auVar30 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(char *)((long)&local_d8 + uVar16 + 2) =
               (char)(uVar5 >> (((bVar14 ^ 0x11) + cVar4) * '\b' & 0x3f));
        }
        auVar34 = pshufhw(auVar44,auVar44,0x84);
        auVar30 = pshufhw(auVar31,auVar31,0x84);
        auVar35 = pshufhw(auVar34,auVar51,0x84);
        auVar30 = packssdw(auVar30 & auVar34,(auVar35 | auVar30 & auVar34) ^ in_XMM13);
        auVar30 = packsswb(auVar30,auVar30);
        if ((auVar30._14_2_ >> 8 & 1) != 0) {
          *(char *)((long)&local_d8 + uVar16 + 3) =
               (char)(uVar5 >> (((bVar14 ^ 0x10) + cVar4) * '\b' & 0x3f));
        }
        uVar16 = uVar16 + 0x10;
        lVar11 = auVar22._8_8_;
        auVar22._0_8_ = auVar22._0_8_ + 0x10;
        auVar22._8_8_ = lVar11 + 0x10;
        lVar11 = auVar23._8_8_;
        auVar23._0_8_ = auVar23._0_8_ + 0x10;
        auVar23._8_8_ = lVar11 + 0x10;
        lVar11 = auVar24._8_8_;
        auVar24._0_8_ = auVar24._0_8_ + 0x10;
        auVar24._8_8_ = lVar11 + 0x10;
        lVar11 = auVar25._8_8_;
        auVar25._0_8_ = auVar25._0_8_ + 0x10;
        auVar25._8_8_ = lVar11 + 0x10;
        lVar11 = auVar26._8_8_;
        auVar26._0_8_ = auVar26._0_8_ + 0x10;
        auVar26._8_8_ = lVar11 + 0x10;
        lVar11 = auVar27._8_8_;
        auVar27._0_8_ = auVar27._0_8_ + 0x10;
        auVar27._8_8_ = lVar11 + 0x10;
        lVar11 = auVar28._8_8_;
        auVar28._0_8_ = auVar28._0_8_ + 0x10;
        auVar28._8_8_ = lVar11 + 0x10;
        lVar11 = auVar29._8_8_;
        auVar29._0_8_ = auVar29._0_8_ + 0x10;
        auVar29._8_8_ = lVar11 + 0x10;
        iVar9 = iVar9 + -0x80;
      } while (uVar18 != uVar16);
    }
    FrameV2::AddByteArray((char *)local_c8,(uchar *)"data",(ulonglong)local_e4);
    if (cVar6 != '\0' || bVar21) {
      FrameV2::AddString((char *)local_c8,"error");
    }
    if (((this->mSettings)._M_t.
         super___uniq_ptr_impl<SerialAnalyzerSettings,_std::default_delete<SerialAnalyzerSettings>_>
         ._M_t.
         super__Tuple_impl<0UL,_SerialAnalyzerSettings_*,_std::default_delete<SerialAnalyzerSettings>_>
         .super__Head_base<0UL,_SerialAnalyzerSettings_*,_false>._M_head_impl)->mSerialMode !=
        Normal) {
      FrameV2::AddBoolean((char *)local_c8,true);
    }
    pSVar3 = (this->mResults)._M_t.
             super___uniq_ptr_impl<SerialAnalyzerResults,_std::default_delete<SerialAnalyzerResults>_>
             ._M_t.
             super__Tuple_impl<0UL,_SerialAnalyzerResults_*,_std::default_delete<SerialAnalyzerResults>_>
             .super__Head_base<0UL,_SerialAnalyzerResults_*,_false>._M_head_impl;
    AnalyzerChannelData::GetSampleNumber();
    AnalyzerResults::AddFrameV2((FrameV2 *)pSVar3,(char *)local_c8,0x1090e0,local_b0);
    AnalyzerResults::CommitResults();
    Analyzer::ReportProgress((ulonglong)this);
    Analyzer::CheckIfThreadShouldExit();
    if ((bVar21) && (BVar8 = AnalyzerChannelData::GetBitState(), BVar8 == this->mBitLow)) {
      AnalyzerChannelData::AdvanceToNextEdge();
    }
    FrameV2::~FrameV2(local_c8);
    Frame::~Frame((Frame *)&local_70);
    DataBuilder::~DataBuilder(local_a8);
  } while( true );
}

Assistant:

void SerialAnalyzer::WorkerThread()
{
    mSampleRateHz = GetSampleRate();
    ComputeSampleOffsets();

    U32 bits_per_transfer = mSettings->mBitsPerTransfer;
    if( mSettings->mSerialMode != SerialAnalyzerEnums::Normal )
        bits_per_transfer++;

    // used for HLA byte count, this should not include an extra bit for MP/MDB
    const U32 bytes_per_transfer = ( mSettings->mBitsPerTransfer + 7 ) / 8;

    if( mSettings->mInverted == false )
    {
        mBitHigh = BIT_HIGH;
        mBitLow = BIT_LOW;
    }
    else
    {
        mBitHigh = BIT_LOW;
        mBitLow = BIT_HIGH;
    }

    U64 bit_mask = 0;
    U64 mask = 0x1ULL;
    for( U32 i = 0; i < bits_per_transfer; i++ )
    {
        bit_mask |= mask;
        mask <<= 1;
    }

    mSerial = GetAnalyzerChannelData( mSettings->mInputChannel );
    mSerial->TrackMinimumPulseWidth();

    if( mSerial->GetBitState() == mBitLow )
        mSerial->AdvanceToNextEdge();

    for( ;; )
    {
        // we're starting high. (we'll assume that we're not in the middle of a byte.)

        mSerial->AdvanceToNextEdge();

        // we're now at the beginning of the start bit.  We can start collecting the data.
        U64 frame_starting_sample = mSerial->GetSampleNumber();

        U64 data = 0;
        bool parity_error = false;
        bool framing_error = false;
        bool mp_is_address = false;

        DataBuilder data_builder;
        data_builder.Reset( &data, mSettings->mShiftOrder, bits_per_transfer );
        U64 marker_location = frame_starting_sample;

        for( U32 i = 0; i < bits_per_transfer; i++ )
        {
            mSerial->Advance( mSampleOffsets[ i ] );
            data_builder.AddBit( mSerial->GetBitState() );

            marker_location += mSampleOffsets[ i ];
            mResults->AddMarker( marker_location, AnalyzerResults::Dot, mSettings->mInputChannel );
        }

        if( mSettings->mInverted == true )
            data = ( ~data ) & bit_mask;

        if( mSettings->mSerialMode != SerialAnalyzerEnums::Normal )
        {
            // extract the MSB
            U64 msb = data >> ( bits_per_transfer - 1 );
            msb &= 0x1;
            if( mSettings->mSerialMode == SerialAnalyzerEnums::MpModeMsbOneMeansAddress )
            {
                mp_is_address = msb == 0x1;
            }
            else if( mSettings->mSerialMode == SerialAnalyzerEnums::MpModeMsbZeroMeansAddress )
            {
                mp_is_address = msb == 0x0;
            }
            // now remove the msb.
            data &= ( bit_mask >> 1 );
        }

        parity_error = false;

        if( mSettings->mParity != AnalyzerEnums::None )
        {
            mSerial->Advance( mParityBitOffset );
            bool is_even = AnalyzerHelpers::IsEven( AnalyzerHelpers::GetOnesCount( data ) );

            if( mSettings->mParity == AnalyzerEnums::Even )
            {
                if( is_even == true )
                {
                    if( mSerial->GetBitState() != mBitLow ) // we expect a low bit, to keep the parity even.
                        parity_error = true;
                }
                else
                {
                    if( mSerial->GetBitState() != mBitHigh ) // we expect a high bit, to force parity even.
                        parity_error = true;
                }
            }
            else // if( mSettings->mParity == AnalyzerEnums::Odd )
            {
                if( is_even == false )
                {
                    if( mSerial->GetBitState() != mBitLow ) // we expect a low bit, to keep the parity odd.
                        parity_error = true;
                }
                else
                {
                    if( mSerial->GetBitState() != mBitHigh ) // we expect a high bit, to force parity odd.
                        parity_error = true;
                }
            }

            marker_location += mParityBitOffset;
            mResults->AddMarker( marker_location, AnalyzerResults::Square, mSettings->mInputChannel );
        }

        // now we must determine if there is a framing error.
        framing_error = false;

        mSerial->Advance( mStartOfStopBitOffset );

        if( mSerial->GetBitState() != mBitHigh )
        {
            framing_error = true;
        }
        else
        {
            U32 num_edges = mSerial->Advance( mEndOfStopBitOffset );
            if( num_edges != 0 )
                framing_error = true;
        }

        if( framing_error == true )
        {
            marker_location += mStartOfStopBitOffset;
            mResults->AddMarker( marker_location, AnalyzerResults::ErrorX, mSettings->mInputChannel );

            if( mEndOfStopBitOffset != 0 )
            {
                marker_location += mEndOfStopBitOffset;
                mResults->AddMarker( marker_location, AnalyzerResults::ErrorX, mSettings->mInputChannel );
            }
        }

        // ok now record the value!
        // note that we're not using the mData2 or mType fields for anything, so we won't bother to set them.
        Frame frame;
        frame.mStartingSampleInclusive = static_cast<S64>( frame_starting_sample );
        frame.mEndingSampleInclusive = static_cast<S64>( mSerial->GetSampleNumber() );
        frame.mData1 = data;
        frame.mFlags = 0;
        if( parity_error == true )
            frame.mFlags |= PARITY_ERROR_FLAG | DISPLAY_AS_ERROR_FLAG;

        if( framing_error == true )
            frame.mFlags |= FRAMING_ERROR_FLAG | DISPLAY_AS_ERROR_FLAG;

        if( mp_is_address == true )
            frame.mFlags |= MP_MODE_ADDRESS_FLAG;

        if( mp_is_address == true )
            mResults->CommitPacketAndStartNewPacket();

        mResults->AddFrame( frame );

        FrameV2 frameV2;

        U8 bytes[ 8 ];
        for( U32 i = 0; i < bytes_per_transfer; ++i )
        {
            auto bit_offset = ( bytes_per_transfer - i - 1 ) * 8;
            bytes[ i ] = static_cast<U8>( data >> bit_offset );
        }
        frameV2.AddByteArray( "data", bytes, bytes_per_transfer );

        if( parity_error )
        {
            frameV2.AddString( "error", "parity" );
        }
        else if( framing_error )
        {
            frameV2.AddString( "error", "framing" );
        }

        if( mSettings->mSerialMode != SerialAnalyzerEnums::Normal )
        {
            frameV2.AddBoolean( "address", mp_is_address );
        }

        mResults->AddFrameV2( frameV2, "data", frame_starting_sample, mSerial->GetSampleNumber() );

        mResults->CommitResults();

        ReportProgress( frame.mEndingSampleInclusive );
        CheckIfThreadShouldExit();

        if( framing_error == true ) // if we're still low, let's fix that for the next round.
        {
            if( mSerial->GetBitState() == mBitLow )
                mSerial->AdvanceToNextEdge();
        }
    }
}